

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

string * __thiscall despot::TagState::text_abi_cxx11_(string *__return_storage_ptr__,TagState *this)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined8 local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined8 local_30;
  Coord opp_pos;
  int opp;
  Coord rob_pos;
  int rob;
  TagState *this_local;
  
  if (BaseTag::current_ == (BaseTag *)0x0) {
    to_string<int>(__return_storage_ptr__,*(int *)&this->field_0xc);
  }
  else {
    BaseTag::StateIndexToRobIndex(BaseTag::current_,*(int *)&this->field_0xc);
    uVar1 = despot::Floor::GetCell((int)BaseTag::current_ + 0x58);
    _opp_pos = BaseTag::StateIndexToOppIndex(BaseTag::current_,*(int *)&this->field_0xc);
    local_30 = despot::Floor::GetCell((int)BaseTag::current_ + 0x58);
    local_98 = uVar1;
    to_string<despot::Coord>(&local_90,uVar1);
    std::operator+(&local_70,"Rob at ",&local_90);
    std::operator+(&local_50,&local_70,", Opp at ");
    to_string<despot::Coord>(&local_c8,local_30);
    std::operator+(__return_storage_ptr__,&local_50,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

string TagState::text() const {
	// NOTE: This will fail if several Tag instances are running
	if (BaseTag::current_ != NULL) {
		int rob = BaseTag::current_->StateIndexToRobIndex(state_id);
		Coord rob_pos = BaseTag::current_->floor_.GetCell(rob);
		int opp = BaseTag::current_->StateIndexToOppIndex(state_id);
		Coord opp_pos = BaseTag::current_->floor_.GetCell(opp);
		return "Rob at " + to_string(rob_pos) + ", Opp at " + to_string(opp_pos);
	} else
		return to_string(state_id);
}